

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O2

void helper_gvec_uqsub_d_aarch64(void *vd,void *vq,void *vn,void *vm,uint32_t desc)

{
  ulong *puVar1;
  uint uVar2;
  ulong uVar3;
  uintptr_t i;
  ulong uVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  
  uVar2 = (desc & 0x1f) * 8 + 8;
  uVar4 = (ulong)uVar2;
  bVar5 = false;
  for (uVar6 = 0; uVar2 >> 3 != uVar6; uVar6 = uVar6 + 1) {
    uVar3 = *(ulong *)((long)vn + uVar6 * 8);
    puVar1 = (ulong *)((long)vm + uVar6 * 8);
    bVar8 = uVar3 < *puVar1;
    lVar7 = 0;
    if (!bVar8) {
      lVar7 = uVar3 - *puVar1;
    }
    bVar5 = (bool)(bVar5 | bVar8);
    *(long *)((long)vd + uVar6 * 8) = lVar7;
  }
  if (bVar5) {
    *(undefined4 *)vq = 1;
  }
  for (; uVar4 < (desc >> 2 & 0xf8) + 8; uVar4 = uVar4 + 8) {
    *(undefined8 *)((long)vd + uVar4) = 0;
  }
  return;
}

Assistant:

void HELPER(gvec_uqsub_d)(void *vd, void *vq, void *vn,
                          void *vm, uint32_t desc)
{
    intptr_t i, oprsz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;
    bool q = false;

    for (i = 0; i < oprsz / 8; i++) {
        uint64_t nn = n[i], mm = m[i], dd = nn - mm;
        if (nn < mm) {
            dd = 0;
            q = true;
        }
        d[i] = dd;
    }
    if (q) {
        uint32_t *qc = vq;
        qc[0] = 1;
    }
    clear_tail(d, oprsz, simd_maxsz(desc));
}